

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_WriteAfterReadSentFatalAlert_Test::TestBody
          (SSLVersionTest_WriteAfterReadSentFatalAlert_Test *this)

{
  char cVar1;
  SSL *ssl;
  AssertionResult *pAVar2;
  undefined8 wbio;
  bool bVar3;
  int iVar4;
  BIO *pBVar5;
  UniquePtr<BIO> *pUVar6;
  BIO_METHOD *type;
  long lVar7;
  char *pcVar8;
  char *in_R9;
  UniquePtr<SSL> *pUVar9;
  ScopedTrace gtest_trace_3166;
  AssertionResult gtest_ar__2;
  AssertHelper local_1a8;
  AssertHelper local_1a0;
  uint8_t *unused;
  AssertionResult gtest_ar_;
  UniquePtr<BIO> mem;
  UniquePtr<BIO> client_wbio;
  char local_15a [2];
  size_t len;
  UniquePtr<BIO> server_wbio;
  char buf [256];
  
  bVar3 = SSLVersionTest::is_dtls(&this->super_SSLVersionTest);
  if (!bVar3) {
    buf._16_8_ = buf + 0x20;
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0x28] = '\0';
    buf[0x29] = '\0';
    buf[0x2a] = '\0';
    buf[0x2b] = '\0';
    buf[0x2c] = '\0';
    buf[0x2d] = '\0';
    buf[0x2e] = '\0';
    buf[0x2f] = '\0';
    buf[0x38] = '\0';
    buf[0x39] = '\0';
    buf[0x3a] = '\0';
    buf[0x3b] = '\0';
    buf[0x3c] = '\0';
    buf[0x3d] = '\0';
    buf[0x3e] = '\0';
    buf[0x3f] = '\0';
    buf[0x48] = '\0';
    buf[0x49] = '\0';
    buf[0x4a] = '\0';
    buf[0x4b] = '\0';
    buf[0x4c] = '\0';
    buf[0x4d] = '\0';
    buf[0x4e] = '\0';
    buf[0x4f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf._48_8_ = buf + 0x40;
    buf[0x20] = '\0';
    buf[0x21] = '\0';
    buf[0x22] = '\0';
    buf[0x23] = '\0';
    buf[0x24] = '\0';
    buf[0x25] = '\0';
    buf[0x26] = '\0';
    buf[0x27] = '\0';
    buf[0x40] = '\0';
    buf[0x41] = '\0';
    buf[0x42] = '\0';
    buf[0x43] = '\0';
    buf[0x44] = '\0';
    buf[0x45] = '\0';
    buf[0x46] = '\0';
    buf[0x47] = '\0';
    buf[0x50] = '\0';
    buf[0x51] = '\0';
    buf[0x52] = '\0';
    buf[0x53] = '\0';
    buf[0x54] = '\0';
    buf[0x55] = '\0';
    buf[0x56] = '\0';
    buf[0x57] = '\0';
    bVar3 = SSLVersionTest::Connect(&this->super_SSLVersionTest,(ClientConfig *)buf);
    gtest_ar_.success_ = bVar3;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    ClientConfig::~ClientConfig((ClientConfig *)buf);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)buf,(internal *)&gtest_ar_,(AssertionResult *)"Connect()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&client_wbio,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xc57,(char *)buf._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&client_wbio,(Message *)&gtest_ar__2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client_wbio);
      std::__cxx11::string::~string((string *)buf);
      if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pBVar5 = SSL_get_wbio((SSL *)(this->super_SSLVersionTest).client_._M_t.
                                   super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      UpRef((bssl *)&client_wbio,(BIO *)pBVar5);
      pBVar5 = SSL_get_wbio((SSL *)(this->super_SSLVersionTest).server_._M_t.
                                   super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      UpRef((bssl *)&server_wbio,(BIO *)pBVar5);
      local_15a[0] = '\0';
      local_15a[1] = '\x01';
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        cVar1 = local_15a[lVar7];
        pcVar8 = "client";
        if (cVar1 != '\0') {
          pcVar8 = "server";
        }
        testing::ScopedTrace::ScopedTrace
                  (&gtest_trace_3166,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xc5e,pcVar8);
        pUVar9 = &(this->super_SSLVersionTest).client_;
        if (cVar1 != '\0') {
          pUVar9 = &(this->super_SSLVersionTest).server_;
        }
        ssl = (SSL *)(pUVar9->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
        pUVar6 = &server_wbio;
        if (cVar1 != '\0') {
          pUVar6 = &client_wbio;
        }
        pBVar5 = (BIO *)(pUVar6->_M_t).super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl;
        type = BIO_s_mem();
        mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)BIO_new(type);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (tuple<bio_st_*,_bssl::internal::Deleter>)
             mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
             (_Head_base<0UL,_bio_st_*,_false>)0x0;
        if ((tuple<bio_st_*,_bssl::internal::Deleter>)
            mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_bio_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&gtest_ar__2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)buf,(internal *)&gtest_ar_,(AssertionResult *)"mem","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&unused,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc63,(char *)buf._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&unused,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unused);
          std::__cxx11::string::~string((string *)buf);
          if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
          }
          pAVar2 = &gtest_ar_;
LAB_0016d4a4:
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&pAVar2->message_);
          std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&mem);
          testing::ScopedTrace::~ScopedTrace(&gtest_trace_3166);
          break;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        UpRef((bssl *)buf,
              (BIO *)mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
        wbio = buf._0_8_;
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        SSL_set0_wbio((SSL *)ssl,(BIO *)wbio);
        std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bio_st,_bssl::internal::Deleter> *)buf);
        gtest_ar_.success_ = true;
        gtest_ar_._1_3_ = 0;
        gtest_ar__2._0_4_ = BIO_write(pBVar5,"invalid record",0xf);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)buf,"int{sizeof(kInvalidRecord)}",
                   "BIO_write(other_wbio, kInvalidRecord, sizeof(kInvalidRecord))",(int *)&gtest_ar_
                   ,(int *)&gtest_ar__2);
        if (buf[0] == '\0') {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar8 = "";
          if (buf._8_8_ != 0) {
            pcVar8 = *(char **)buf._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc69,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
          if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(buf + 8));
        gtest_ar__2.success_ = true;
        gtest_ar__2._1_3_ = 0xffffff;
        unused._0_4_ = SSL_read(ssl,buf,0x100);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"-1","SSL_read(ssl, buf, sizeof(buf))",(int *)&gtest_ar__2
                   ,(int *)&unused);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__2);
          pcVar8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&unused,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc6b,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&unused,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unused);
          if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar4 = BIO_mem_contents((BIO *)mem._M_t.
                                        super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,&unused,
                                 &len);
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__2.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                     (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc70,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
          testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1a8);
LAB_0016d47b:
          testing::internal::AssertHelper::~AssertHelper(&local_1a0);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if ((long *)CONCAT44(local_1a8.data_._4_4_,(int)local_1a8.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1a8.data_._4_4_,(int)local_1a8.data_) + 8))();
          }
          pAVar2 = &gtest_ar__2;
          goto LAB_0016d4a4;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        gtest_ar__2.success_ = false;
        gtest_ar__2._1_3_ = 0;
        testing::internal::CmpHelperNE<unsigned_int,unsigned_long>
                  ((internal *)&gtest_ar_,"0u","len",(uint *)&gtest_ar__2,&len);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__2);
          pcVar8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc71,pcVar8);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar4 = BIO_reset((BIO *)mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__2.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                     (AssertionResult *)"BIO_reset(mem.get())","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc72,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
          testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1a8);
          testing::internal::AssertHelper::~AssertHelper(&local_1a0);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if ((long *)CONCAT44(local_1a8.data_._4_4_,(int)local_1a8.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1a8.data_._4_4_,(int)local_1a8.data_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        gtest_ar__2.success_ = true;
        gtest_ar__2._1_3_ = 0xffffff;
        local_1a8.data_._0_4_ = SSL_write(ssl,"a",1);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"-1","SSL_write(ssl, \"a\", 1)",(int *)&gtest_ar__2,
                   (int *)&local_1a8);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__2);
          pcVar8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc75,pcVar8);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar4 = BIO_mem_contents((BIO *)mem._M_t.
                                        super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,&unused,
                                 &len);
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__2.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                     (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc78,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
          testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1a8);
          goto LAB_0016d47b;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        gtest_ar__2.success_ = false;
        gtest_ar__2._1_3_ = 0;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&gtest_ar_,"0u","len",(uint *)&gtest_ar__2,&len);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__2);
          pcVar8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc79,pcVar8);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&mem);
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_3166);
      }
      std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&server_wbio);
      std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&client_wbio);
    }
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, WriteAfterReadSentFatalAlert) {
  // Decryption failures are not fatal in DTLS.
  if (is_dtls()) {
    return;
  }

  ASSERT_TRUE(Connect());

  // Save the write |BIO|s as the test will overwrite them.
  bssl::UniquePtr<BIO> client_wbio = bssl::UpRef(SSL_get_wbio(client_.get()));
  bssl::UniquePtr<BIO> server_wbio = bssl::UpRef(SSL_get_wbio(server_.get()));

  for (bool test_server : {false, true}) {
    SCOPED_TRACE(test_server ? "server" : "client");
    SSL *ssl = test_server ? server_.get() : client_.get();
    BIO *other_wbio = test_server ? client_wbio.get() : server_wbio.get();

    bssl::UniquePtr<BIO> mem(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(mem);
    SSL_set0_wbio(ssl, bssl::UpRef(mem).release());

    // Read an invalid record from the peer.
    static const uint8_t kInvalidRecord[] = "invalid record";
    EXPECT_EQ(int{sizeof(kInvalidRecord)},
              BIO_write(other_wbio, kInvalidRecord, sizeof(kInvalidRecord)));
    char buf[256];
    EXPECT_EQ(-1, SSL_read(ssl, buf, sizeof(buf)));

    // |ssl| should have written an alert to the transport.
    const uint8_t *unused;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_NE(0u, len);
    EXPECT_TRUE(BIO_reset(mem.get()));

    // Writing should fail.
    EXPECT_EQ(-1, SSL_write(ssl, "a", 1));

    // Nothing should be written to the transport.
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_EQ(0u, len);
  }
}